

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::Connection::QueryParamsRecursive
          (Connection *this,string *query,vector<duckdb::Value,_true> *values)

{
  ClientContext *query_00;
  pointer pPVar1;
  duckdb *in_RCX;
  case_insensitive_map_t<BoundParameterData> named_params;
  undefined1 local_60 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_50;
  
  ConvertParamListToMap_abi_cxx11_
            ((case_insensitive_map_t<BoundParameterData> *)&local_50,in_RCX,values);
  query_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)query);
  ClientContext::PendingQuery
            ((ClientContext *)local_60,(string *)query_00,
             (case_insensitive_map_t<BoundParameterData> *)values,SUB81(&local_50,0));
  pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_60);
  if ((pPVar1->super_BaseQueryResult).success == false) {
    pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_60);
    make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData&>
              ((duckdb *)&local_58,&(pPVar1->super_BaseQueryResult).error);
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_58._M_pi;
  }
  else {
    unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
    operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                *)local_60);
    PendingQueryResult::Execute((PendingQueryResult *)this);
  }
  if ((tuple<duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>)
      local_60 != (_Head_base<0UL,_duckdb::PendingQueryResult_*,_false>)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_50);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> Connection::QueryParamsRecursive(const string &query, vector<Value> &values) {
	auto named_params = ConvertParamListToMap(values);
	auto pending = PendingQuery(query, named_params, false);
	if (pending->HasError()) {
		return make_uniq<MaterializedQueryResult>(pending->GetErrorObject());
	}
	return pending->Execute();
}